

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O1

bool QPDF::pipeStreamData
               (shared_ptr<QPDF::EncryptionParameters> *encp,shared_ptr<InputSource> *file,
               QPDF *qpdf_for_warning,QPDFObjGen og,qpdf_offset_t offset,size_t length,
               QPDFObjectHandle *stream_dict,bool is_root_metadata,Pipeline *pipeline,
               bool suppress_warnings,bool will_retry)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  QPDFObjGen pipeline_00;
  unique_ptr<Pipeline,_std::default_delete<Pipeline>_> to_delete;
  string buf;
  string local_188;
  string local_168;
  QPDFExc *local_148;
  _Head_base<0UL,_Pipeline_*,_false> local_140;
  QPDFObjGen local_138;
  shared_ptr<InputSource> local_110;
  shared_ptr<QPDF::EncryptionParameters> local_100 [5];
  long *local_b0;
  size_t local_a8;
  long local_a0 [14];
  
  local_140._M_head_impl = (Pipeline *)0x0;
  peVar1 = (encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_138 = og;
  if (peVar1->encrypted == true) {
    local_100[0].super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_100[0].super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_100[0].super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_100[0].
              super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_100[0].super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_100[0].
              super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
      }
    }
    local_110.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (file->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_110.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (file->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_110.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_110.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_110.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_110.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_110.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    pipeline_00 = (QPDFObjGen)&pipeline;
    local_100[0].super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    decryptStream(local_100,&local_110,qpdf_for_warning,(Pipeline **)pipeline_00,og,stream_dict,
                  is_root_metadata,
                  (unique_ptr<Pipeline,_std::default_delete<Pipeline>_> *)&local_140);
    og = pipeline_00;
    if (local_110.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_110.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      og = pipeline_00;
    }
    if (local_100[0].super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100[0].
                 super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  peVar2 = (file->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)length);
  if (-1 < offset) {
    (*peVar2->_vptr_InputSource[5])(peVar2,offset,0);
  }
  std::__cxx11::string::resize((ulong)&local_b0,(char)length);
  iVar3 = (*peVar2->_vptr_InputSource[7])(peVar2,local_b0,length);
  std::__cxx11::string::resize((ulong)&local_b0,(char)iVar3);
  if (local_a8 == length) {
    Pipeline::write(pipeline,(int)local_b0,(void *)length,(size_t)og);
    (*pipeline->_vptr_Pipeline[3])();
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
    if (local_140._M_head_impl != (Pipeline *)0x0) {
      (*(local_140._M_head_impl)->_vptr_Pipeline[1])();
    }
    return true;
  }
  local_148 = (QPDFExc *)__cxa_allocate_exception(0x80);
  peVar2 = (file->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"");
  if ((long)local_a8 < 0) {
    QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(local_a8);
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_168,"unexpected EOF reading stream data","");
  iVar3 = (*peVar2->_vptr_InputSource[3])(peVar2);
  QPDFExc::QPDFExc(local_148,qpdf_e_damaged_pdf,(string *)CONCAT44(extraout_var,iVar3),&local_188,
                   local_a8 + offset,&local_168,true);
  __cxa_throw(local_148,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

bool
QPDF::pipeStreamData(
    std::shared_ptr<EncryptionParameters> encp,
    std::shared_ptr<InputSource> file,
    QPDF& qpdf_for_warning,
    QPDFObjGen og,
    qpdf_offset_t offset,
    size_t length,
    QPDFObjectHandle stream_dict,
    bool is_root_metadata,
    Pipeline* pipeline,
    bool suppress_warnings,
    bool will_retry)
{
    std::unique_ptr<Pipeline> to_delete;
    if (encp->encrypted) {
        decryptStream(
            encp, file, qpdf_for_warning, pipeline, og, stream_dict, is_root_metadata, to_delete);
    }

    bool attempted_finish = false;
    try {
        auto buf = file->read(length, offset);
        if (buf.size() != length) {
            throw damagedPDF(
                *file, "", offset + toO(buf.size()), "unexpected EOF reading stream data");
        }
        pipeline->write(buf.data(), length);
        attempted_finish = true;
        pipeline->finish();
        return true;
    } catch (QPDFExc& e) {
        if (!suppress_warnings) {
            qpdf_for_warning.warn(e);
        }
    } catch (std::exception& e) {
        if (!suppress_warnings) {
            QTC::TC("qpdf", "QPDF decoding error warning");
            qpdf_for_warning.warn(
                // line-break
                damagedPDF(
                    *file,
                    "",
                    file->getLastOffset(),
                    ("error decoding stream data for object " + og.unparse(' ') + ": " +
                     e.what())));
            if (will_retry) {
                qpdf_for_warning.warn(
                    // line-break
                    damagedPDF(
                        *file,
                        "",
                        file->getLastOffset(),
                        "stream will be re-processed without filtering to avoid data loss"));
            }
        }
    }
    if (!attempted_finish) {
        try {
            pipeline->finish();
        } catch (std::exception&) {
            // ignore
        }
    }
    return false;
}